

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::disconnect(CoreBroker *this)

{
  BrokerBase *this_00;
  GlobalFederateId GVar1;
  pointer pcVar2;
  size_type sVar3;
  string_view message;
  string_view message_00;
  string_view message_01;
  bool bVar4;
  string *__rhs;
  ulong uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar6;
  int iVar7;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  format_args args;
  __atomic_base<unsigned_long> local_f8 [2];
  undefined1 local_e8 [184];
  
  this_00 = &this->super_BrokerBase;
  ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_user_disconnect);
  BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  bVar4 = waitForDisconnect(this,(milliseconds)0xc8);
  if (!bVar4) {
    iVar7 = -1;
    uVar5 = 1;
    do {
      GVar1.gid = (this->super_BrokerBase).global_id._M_i.gid;
      pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar3 = (this->super_BrokerBase).identifier._M_string_length;
      __rhs = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     "waiting on disconnect: current state=",__rhs);
      aVar6.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = (char *)local_e8._0_8_;
      message._M_len = local_e8._8_8_;
      name._M_str = pcVar2;
      name._M_len = sVar3;
      BrokerBase::sendToLogger(this_00,GVar1,3,name,message,false);
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      if ((uVar5 & 3) == 0) {
        GVar1.gid = (this->super_BrokerBase).global_id._M_i.gid;
        pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar3 = (this->super_BrokerBase).identifier._M_string_length;
        if (((this->super_BrokerBase).mainLoopIsRunning._M_base._M_i & 1U) == 0) {
          message_01._M_str =
               "main loop is stopped but have not received disconnect notice, assuming disconnected"
          ;
          message_01._M_len = 0x53;
          name_01._M_str = pcVar2;
          name_01._M_len = sVar3;
          BrokerBase::sendToLogger(this_00,GVar1,3,name_01,message_01,false);
          return;
        }
        local_f8[0]._M_i =
             (this->super_BrokerBase).messageCounter.super___atomic_base<unsigned_long>._M_i;
        fmt.size_ = 4;
        fmt.data_ = (char *)0x32;
        args.field_1.values_ = aVar6.values_;
        args.desc_ = (unsigned_long_long)local_f8;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_e8,(v11 *)"sending disconnect again; total message count = {}",
                   fmt,args);
        message_00._M_str = (char *)local_e8._0_8_;
        message_00._M_len = local_e8._8_8_;
        name_00._M_str = pcVar2;
        name_00._M_len = sVar3;
        BrokerBase::sendToLogger(this_00,GVar1,3,name_00,message_00,false);
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_user_disconnect);
        BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      }
      if ((int)(uVar5 / 0xd) + (int)(uVar5 / 0xd) * 0xc + iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"waiting on disconnect\n",0x16);
      }
      bVar4 = waitForDisconnect(this,(milliseconds)0xc8);
      iVar7 = iVar7 + -1;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (!bVar4);
  }
  return;
}

Assistant:

void CoreBroker::disconnect()
{
    addActionMessage(CMD_USER_DISCONNECT);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            LOG_WARNING(global_id.load(),
                        getIdentifier(),
                        fmt::format("sending disconnect again; total message count = {}",
                                    currentMessageCounter()));
            addActionMessage(CMD_USER_DISCONNECT);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect\n";
        }
    }
}